

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create.cpp
# Opt level: O1

bool __thiscall create::Create::isCliff(Create *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint16_t uVar4;
  uint16_t uVar5;
  Packet *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  Packet *local_48;
  _Base_ptr local_40;
  Packet *local_38;
  _Base_ptr local_30;
  Packet *local_28;
  _Base_ptr local_20;
  
  bVar3 = Data::isValidPacketID
                    ((this->data).super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,'\t');
  if ((((!bVar3) ||
       (bVar3 = Data::isValidPacketID
                          ((this->data).super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,'\n'), !bVar3)) ||
      (bVar3 = Data::isValidPacketID
                         ((this->data).super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,'\v'), !bVar3)) ||
     (bVar3 = Data::isValidPacketID
                        ((this->data).super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,'\f'), !bVar3)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"[create::Create] ",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Cliff sensors not supported!",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    return false;
  }
  Data::getPacket((Data *)&local_28,
                  (uint8_t)(this->data).super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr);
  uVar4 = Packet::getData(local_28);
  bVar3 = true;
  if (uVar4 != 1) {
    Data::getPacket((Data *)&local_38,
                    (uint8_t)(this->data).
                             super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    uVar5 = Packet::getData(local_38);
    if (uVar5 != 1) {
      Data::getPacket((Data *)&local_48,
                      (uint8_t)(this->data).
                               super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      uVar5 = Packet::getData(local_48);
      if (uVar5 == 1) {
        bVar2 = true;
        bVar1 = false;
        bVar3 = true;
      }
      else {
        Data::getPacket((Data *)&local_58,
                        (uint8_t)(this->data).
                                 super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       );
        uVar5 = Packet::getData(local_58);
        bVar3 = uVar5 == 1;
        bVar2 = true;
        bVar1 = true;
      }
      goto LAB_00131e96;
    }
  }
  bVar2 = false;
  bVar1 = false;
LAB_00131e96:
  if ((bVar1) && (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if ((bVar2) && (local_40 != (_Base_ptr)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40);
  }
  if ((uVar4 != 1) && (local_30 != (_Base_ptr)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30);
  }
  if (local_20 == (_Base_ptr)0x0) {
    return bVar3;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20);
  return bVar3;
}

Assistant:

bool Create::isCliff() const {
    if (data->isValidPacketID(ID_CLIFF_LEFT) &&
        data->isValidPacketID(ID_CLIFF_FRONT_LEFT) &&
        data->isValidPacketID(ID_CLIFF_FRONT_RIGHT) &&
        data->isValidPacketID(ID_CLIFF_RIGHT)) {
      return GET_DATA(ID_CLIFF_LEFT) == 1 ||
             GET_DATA(ID_CLIFF_FRONT_LEFT) == 1 ||
             GET_DATA(ID_CLIFF_FRONT_RIGHT) == 1 ||
             GET_DATA(ID_CLIFF_RIGHT) == 1;
    }
    else {
      CERR("[create::Create] ", "Cliff sensors not supported!");
      return false;
    }
  }